

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O3

int __thiscall
icu_63::IslamicCalendar::clone
          (IslamicCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Calendar *this_00;
  
  this_00 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 != (Calendar *)0x0) {
    Calendar::Calendar(this_00,&this->super_Calendar);
    (this_00->super_UObject)._vptr_UObject = (_func_int **)&PTR__IslamicCalendar_003a3370;
    *(undefined4 *)&this_00->field_0x264 = *(undefined4 *)&(this->super_Calendar).field_0x264;
  }
  return (int)this_00;
}

Assistant:

Calendar* IslamicCalendar::clone() const {
    return new IslamicCalendar(*this);
}